

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O3

char * parse_id(char *p,char **save)

{
  ushort uVar1;
  ushort *puVar2;
  long lVar3;
  ushort **ppuVar4;
  union_tag *puVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  char *pcVar9;
  
  ppuVar4 = __ctype_b_loc();
  puVar2 = *ppuVar4;
  uVar6 = (ulong)*p;
  uVar1 = puVar2[uVar6];
  iVar7 = rescan_lineno;
  while ((uVar1 >> 0xd & 1) != 0) {
    if ((char)uVar6 == '\n') {
      iVar7 = iVar7 + 1;
      rescan_lineno = iVar7;
    }
    p = p + 1;
    uVar6 = (ulong)*p;
    uVar1 = puVar2[uVar6];
  }
  if (((char)uVar6 == '_') || ((uVar1 & 0x400) != 0)) {
    lVar8 = 0;
    while ((((puVar2[(char)uVar6] & 8) != 0 || ((char)uVar6 == '_')) ||
           (((uint)uVar6 & 0xff) == 0x24))) {
      lVar3 = lVar8 + 1;
      lVar8 = lVar8 + 1;
      uVar6 = (ulong)(byte)p[lVar3];
    }
    pcVar9 = p + lVar8;
    if (save != (char **)0x0) {
      puVar5 = cache_tag(p,(int)lVar8);
      *save = puVar5->name;
    }
  }
  else {
    pcVar9 = (char *)0x0;
  }
  return pcVar9;
}

Assistant:

static char *parse_id(char *p, char **save)
{
char	*b;

    while (isspace(*p)) if (*p++ == '\n') rescan_lineno++;
    if (!isalpha(*p) && *p != '_') return 0;
    b = p;
    while (isalnum(*p) || *p == '_' || *p == '$') p++;
    if (save) {
	*save = cache_tag(b, p-b)->name; }
    return p;
}